

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# well_known_types_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::WellKnownTypesTest_AllKnownTypesAreIncluded_Test::
~WellKnownTypesTest_AllKnownTypesAreIncluded_Test
          (WellKnownTypesTest_AllKnownTypesAreIncluded_Test *this)

{
  WellKnownTypesTest_AllKnownTypesAreIncluded_Test *this_local;
  
  ~WellKnownTypesTest_AllKnownTypesAreIncluded_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(WellKnownTypesTest, AllKnownTypesAreIncluded) {
  proto2_unittest::TestWellKnownTypes message;
  EXPECT_EQ(0, message.any_field().ByteSize());
  EXPECT_EQ(0, message.api_field().ByteSize());
  EXPECT_EQ(0, message.duration_field().ByteSize());
  EXPECT_EQ(0, message.empty_field().ByteSize());
  EXPECT_EQ(0, message.field_mask_field().ByteSize());
  EXPECT_EQ(0, message.source_context_field().ByteSize());
  EXPECT_EQ(0, message.struct_field().ByteSize());
  EXPECT_EQ(0, message.timestamp_field().ByteSize());
  EXPECT_EQ(0, message.type_field().ByteSize());
  EXPECT_EQ(0, message.int32_field().ByteSize());
}